

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O0

fsg_model_t * fsg_model_read(FILE *fp,logmath_t *lmath,float32 lw)

{
  glist_t g;
  hash_iter_t *h;
  int iVar1;
  int32 iVar2;
  char *key;
  fsg_link_t *ptr;
  hash_entry_t *phVar3;
  double dVar4;
  int32 wid_1;
  char *word;
  int32 local_90;
  int32 tprob;
  int32 wid;
  float32 p;
  glist_t nulls;
  int local_78;
  int n_null_trans;
  int n_trans;
  int n_state;
  int32 j;
  int32 i;
  int32 n;
  int32 lineno;
  char *fsgname;
  char *lineptr;
  char **wordptr;
  hash_iter_t *phStack_40;
  int32 lastwid;
  hash_iter_t *itor;
  hash_table_t *vocab;
  fsg_model_t *fsg;
  logmath_t *plStack_20;
  float32 lw_local;
  logmath_t *lmath_local;
  FILE *fp_local;
  
  i = 0;
  fsg._4_4_ = lw;
  plStack_20 = lmath;
  lmath_local = (logmath_t *)fp;
  itor = (hash_iter_t *)hash_table_new(0x20,0);
  lineptr = (char *)0x0;
  fsgname = (char *)0x0;
  _wid = (glist_t)0x0;
  _n = (char *)0x0;
  vocab = (hash_table_t *)0x0;
  do {
    j = nextline_str2words((FILE *)lmath_local,&i,&fsgname,(char ***)&lineptr);
    if (j < 0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
              ,0x21f,"%s declaration missing\n","FSG_BEGIN");
      goto LAB_0010c7a4;
    }
    iVar1 = strcmp(*(char **)lineptr,"FSG_BEGIN");
  } while (iVar1 != 0);
  if (j < 3) {
    if (j == 2) {
      _n = __ckd_salloc__(*(char **)(lineptr + 8),
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                          ,0x230);
    }
    else {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
              ,0x233,"FSG name is missing\n");
      _n = __ckd_salloc__("unknown",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                          ,0x234);
    }
    j = nextline_str2words((FILE *)lmath_local,&i,&fsgname,(char ***)&lineptr);
    if ((j == 2) &&
       ((((iVar1 = strcmp(*(char **)lineptr,"N"), iVar1 == 0 ||
          (iVar1 = strcmp(*(char **)lineptr,"NUM_STATES"), iVar1 == 0)) &&
         (iVar1 = __isoc99_sscanf(*(undefined8 *)(lineptr + 8),"%d",&n_null_trans), iVar1 == 1)) &&
        (0 < n_null_trans)))) {
      vocab = (hash_table_t *)fsg_model_init(_n,plStack_20,fsg._4_4_,n_null_trans);
      ckd_free(_n);
      _n = (char *)0x0;
      j = nextline_str2words((FILE *)lmath_local,&i,&fsgname,(char ***)&lineptr);
      if ((((j == 2) &&
           ((iVar1 = strcmp(*(char **)lineptr,"S"), iVar1 == 0 ||
            (iVar1 = strcmp(*(char **)lineptr,"START_STATE"), iVar1 == 0)))) &&
          (iVar1 = __isoc99_sscanf(*(undefined8 *)(lineptr + 8),"%d",&vocab[2].inuse), iVar1 == 1))
         && ((-1 < vocab[2].inuse && (vocab[2].inuse < vocab[2].size)))) {
        j = nextline_str2words((FILE *)lmath_local,&i,&fsgname,(char ***)&lineptr);
        if (((j == 2) &&
            (((iVar1 = strcmp(*(char **)lineptr,"F"), iVar1 == 0 ||
              (iVar1 = strcmp(*(char **)lineptr,"FINAL_STATE"), iVar1 == 0)) &&
             (iVar1 = __isoc99_sscanf(*(undefined8 *)(lineptr + 8),"%d",&vocab[2].nocase),
             iVar1 == 1)))) && ((-1 < vocab[2].nocase && (vocab[2].nocase < vocab[2].size)))) {
          wordptr._4_4_ = 0;
          nulls._4_4_ = 0;
          local_78 = 0;
          while (j = nextline_str2words((FILE *)lmath_local,&i,&fsgname,(char ***)&lineptr), 0 < j)
          {
            iVar1 = strcmp(*(char **)lineptr,"FSG_END");
            if (iVar1 == 0) {
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                      ,0x2aa,"FSG: %d states, %d unique words, %d transitions (%d null)\n",
                      (ulong)(uint)vocab[2].size,(ulong)*(uint *)((long)&itor->ent + 4),local_78,
                      nulls._4_4_);
              vocab->nocase = *(int32 *)((long)&itor->ent + 4);
              *(int32 *)&vocab->field_0x14 = vocab->nocase + 10;
              phVar3 = (hash_entry_t *)
                       __ckd_calloc__((long)*(int *)&vocab->field_0x14,8,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                      ,0x2b0);
              vocab[1].table = phVar3;
              for (phStack_40 = hash_table_iter((hash_table_t *)itor);
                  phStack_40 != (hash_iter_t *)0x0; phStack_40 = hash_table_iter_next(phStack_40)) {
                (&(vocab[1].table)->key)[(int)phStack_40->ent->val] = phStack_40->ent->key;
              }
              hash_table_free((hash_table_t *)itor);
              _wid = fsg_model_null_trans_closure((fsg_model_t *)vocab,_wid);
              glist_free(_wid);
              ckd_free(fsgname);
              ckd_free(lineptr);
              return (fsg_model_t *)vocab;
            }
            iVar1 = strcmp(*(char **)lineptr,"T");
            if ((iVar1 != 0) && (iVar1 = strcmp(*(char **)lineptr,"TRANSITION"), iVar1 != 0)) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                      ,0x28f,"Line[%d]: transition or FSG_END statement expected\n",(ulong)(uint)i);
              goto LAB_0010c7a4;
            }
            if ((((j != 4) && (j != 5)) ||
                (iVar1 = __isoc99_sscanf(*(undefined8 *)(lineptr + 8),"%d",&n_state), iVar1 != 1))
               || (((iVar1 = __isoc99_sscanf(*(undefined8 *)(lineptr + 0x10),"%d",&n_trans),
                    iVar1 != 1 || (n_state < 0)) ||
                   ((vocab[2].size <= n_state || ((n_trans < 0 || (vocab[2].size <= n_trans))))))))
            {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                      ,0x281,
                      "Line[%d]: transition spec malformed; Expecting: from-state to-state trans-prob [word]\n"
                      ,(ulong)(uint)i);
              goto LAB_0010c7a4;
            }
            dVar4 = atof_c(*(char **)(lineptr + 0x18));
            tprob = (int32)(float)dVar4;
            if (((float)tprob <= 0.0) || (1.0 < (float)tprob)) {
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                      ,0x289,
                      "Line[%d]: transition spec malformed; Expecting float as transition probability\n"
                      ,(ulong)(uint)i);
              goto LAB_0010c7a4;
            }
            iVar1 = logmath_log(plStack_20,(float64)(double)(float)tprob);
            iVar1 = (int)((float)iVar1 * *(float *)&vocab[2].field_0x14);
            if (j < 5) {
              iVar2 = fsg_model_null_trans_add((fsg_model_t *)vocab,n_state,n_trans,iVar1);
              g = _wid;
              if (iVar2 == 1) {
                nulls._4_4_ = nulls._4_4_ + 1;
                ptr = fsg_model_null_trans((fsg_model_t *)vocab,n_state,n_trans);
                _wid = glist_add_ptr(g,ptr);
              }
            }
            else {
              iVar2 = hash_table_lookup_int32
                                ((hash_table_t *)itor,*(char **)(lineptr + 0x20),&local_90);
              h = itor;
              if (iVar2 < 0) {
                key = __ckd_salloc__(*(char **)(lineptr + 0x20),
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                     ,0x298);
                hash_table_enter((hash_table_t *)h,key,(void *)(long)wordptr._4_4_);
                local_90 = wordptr._4_4_;
                wordptr._4_4_ = wordptr._4_4_ + 1;
              }
              fsg_model_trans_add((fsg_model_t *)vocab,n_state,n_trans,iVar1,local_90);
              local_78 = local_78 + 1;
            }
          }
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                  ,0x26e,"Line[%d]: transition or FSG_END statement expected\n",(ulong)(uint)i);
        }
        else {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                  ,0x261,"Line[%d]: final state declaration line missing or malformed\n",
                  (ulong)(uint)i);
        }
      }
      else {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                ,0x253,"Line[%d]: start state declaration line missing or malformed\n",
                (ulong)(uint)i);
      }
    }
    else {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
              ,0x240,"Line[%d]: #states declaration line missing or malformed\n",(ulong)(uint)i);
    }
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
            ,0x226,"Line[%d]: malformed FSG_BEGIN declaration\n",(ulong)(uint)i);
  }
LAB_0010c7a4:
  for (phStack_40 = hash_table_iter((hash_table_t *)itor); phStack_40 != (hash_iter_t *)0x0;
      phStack_40 = hash_table_iter_next(phStack_40)) {
    ckd_free(phStack_40->ent->key);
  }
  glist_free(_wid);
  hash_table_free((hash_table_t *)itor);
  ckd_free(_n);
  ckd_free(fsgname);
  ckd_free(lineptr);
  fsg_model_free((fsg_model_t *)vocab);
  return (fsg_model_t *)0x0;
}

Assistant:

fsg_model_t *
fsg_model_read(FILE * fp, logmath_t * lmath, float32 lw)
{
    fsg_model_t *fsg;
    hash_table_t *vocab;
    hash_iter_t *itor;
    int32 lastwid;
    char **wordptr;
    char *lineptr;
    char *fsgname;
    int32 lineno;
    int32 n, i, j;
    int n_state, n_trans, n_null_trans;
    glist_t nulls;
    float32 p;

    lineno = 0;
    vocab = hash_table_new(32, FALSE);
    wordptr = NULL;
    lineptr = NULL;
    nulls = NULL;
    fsgname = NULL;
    fsg = NULL;

    /* Scan upto FSG_BEGIN header */
    for (;;) {
        n = nextline_str2words(fp, &lineno, &lineptr, &wordptr);
        if (n < 0) {
            E_ERROR("%s declaration missing\n", FSG_MODEL_BEGIN_DECL);
            goto parse_error;
        }

        if ((strcmp(wordptr[0], FSG_MODEL_BEGIN_DECL) == 0)) {
            if (n > 2) {
                E_ERROR("Line[%d]: malformed FSG_BEGIN declaration\n",
                        lineno);
                goto parse_error;
            }
            break;
        }
    }
    /* Save FSG name, or it will get clobbered below :(.
     * If name is missing, try the default.
     */
    if (n == 2) {
        fsgname = ckd_salloc(wordptr[1]);
    }
    else {
        E_WARN("FSG name is missing\n");
        fsgname = ckd_salloc("unknown");
    }

    /* Read #states */
    n = nextline_str2words(fp, &lineno, &lineptr, &wordptr);
    if ((n != 2)
        || ((strcmp(wordptr[0], FSG_MODEL_N_DECL) != 0)
            && (strcmp(wordptr[0], FSG_MODEL_NUM_STATES_DECL) != 0))
        || (sscanf(wordptr[1], "%d", &n_state) != 1)
        || (n_state <= 0)) {
        E_ERROR
            ("Line[%d]: #states declaration line missing or malformed\n",
             lineno);
        goto parse_error;
    }

    /* Now create the FSG. */
    fsg = fsg_model_init(fsgname, lmath, lw, n_state);
    ckd_free(fsgname);
    fsgname = NULL;

    /* Read start state */
    n = nextline_str2words(fp, &lineno, &lineptr, &wordptr);
    if ((n != 2)
        || ((strcmp(wordptr[0], FSG_MODEL_S_DECL) != 0)
            && (strcmp(wordptr[0], FSG_MODEL_START_STATE_DECL) != 0))
        || (sscanf(wordptr[1], "%d", &(fsg->start_state)) != 1)
        || (fsg->start_state < 0)
        || (fsg->start_state >= fsg->n_state)) {
        E_ERROR
            ("Line[%d]: start state declaration line missing or malformed\n",
             lineno);
        goto parse_error;
    }

    /* Read final state */
    n = nextline_str2words(fp, &lineno, &lineptr, &wordptr);
    if ((n != 2)
        || ((strcmp(wordptr[0], FSG_MODEL_F_DECL) != 0)
            && (strcmp(wordptr[0], FSG_MODEL_FINAL_STATE_DECL) != 0))
        || (sscanf(wordptr[1], "%d", &(fsg->final_state)) != 1)
        || (fsg->final_state < 0)
        || (fsg->final_state >= fsg->n_state)) {
        E_ERROR
            ("Line[%d]: final state declaration line missing or malformed\n",
             lineno);
        goto parse_error;
    }

    /* Read transitions */
    lastwid = 0;
    n_trans = n_null_trans = 0;
    for (;;) {
        int32 wid, tprob;

        n = nextline_str2words(fp, &lineno, &lineptr, &wordptr);
        if (n <= 0) {
            E_ERROR("Line[%d]: transition or FSG_END statement expected\n",
                    lineno);
            goto parse_error;
        }

        if ((strcmp(wordptr[0], FSG_MODEL_END_DECL) == 0)) {
            break;
        }

        if ((strcmp(wordptr[0], FSG_MODEL_T_DECL) == 0)
            || (strcmp(wordptr[0], FSG_MODEL_TRANSITION_DECL) == 0)) {


            if (((n != 4) && (n != 5))
                || (sscanf(wordptr[1], "%d", &i) != 1)
                || (sscanf(wordptr[2], "%d", &j) != 1)
                || (i < 0) || (i >= fsg->n_state)
                || (j < 0) || (j >= fsg->n_state)) {
                E_ERROR
                    ("Line[%d]: transition spec malformed; Expecting: from-state to-state trans-prob [word]\n",
                     lineno);
                goto parse_error;
            }

            p = atof_c(wordptr[3]);
            if ((p <= 0.0) || (p > 1.0)) {
                E_ERROR
                    ("Line[%d]: transition spec malformed; Expecting float as transition probability\n",
                     lineno);
                goto parse_error;
            }
        }
        else {
            E_ERROR("Line[%d]: transition or FSG_END statement expected\n",
                    lineno);
            goto parse_error;
        }

        tprob = (int32) (logmath_log(lmath, p) * fsg->lw);
        /* Add word to "dictionary". */
        if (n > 4) {
            if (hash_table_lookup_int32(vocab, wordptr[4], &wid) < 0) {
                (void) hash_table_enter_int32(vocab,
                                              ckd_salloc(wordptr[4]),
                                              lastwid);
                wid = lastwid;
                ++lastwid;
            }
            fsg_model_trans_add(fsg, i, j, tprob, wid);
            ++n_trans;
        }
        else {
            if (fsg_model_null_trans_add(fsg, i, j, tprob) == 1) {
                ++n_null_trans;
                nulls =
                    glist_add_ptr(nulls, fsg_model_null_trans(fsg, i, j));
            }
        }
    }

    E_INFO("FSG: %d states, %d unique words, %d transitions (%d null)\n",
           fsg->n_state, hash_table_inuse(vocab), n_trans, n_null_trans);


    /* Now create a string table from the "dictionary" */
    fsg->n_word = hash_table_inuse(vocab);
    fsg->n_word_alloc = fsg->n_word + 10;       /* Pad it a bit. */
    fsg->vocab = ckd_calloc(fsg->n_word_alloc, sizeof(*fsg->vocab));
    for (itor = hash_table_iter(vocab); itor;
         itor = hash_table_iter_next(itor)) {
        char const *word = hash_entry_key(itor->ent);
        int32 wid = (int32) (size_t) hash_entry_val(itor->ent);
        fsg->vocab[wid] = (char *) word;
    }
    hash_table_free(vocab);

    /* Do transitive closure on null transitions.  FIXME: This is
     * actually quite inefficient as it *creates* a lot of new links
     * as opposed to just *calculating* the epsilon-closure for each
     * state.  Ideally we would epsilon-remove or determinize the FSG
     * (but note that tag transitions are not really epsilons...) */
    nulls = fsg_model_null_trans_closure(fsg, nulls);
    glist_free(nulls);

    ckd_free(lineptr);
    ckd_free(wordptr);

    return fsg;

  parse_error:
    for (itor = hash_table_iter(vocab); itor;
         itor = hash_table_iter_next(itor))
        ckd_free((char *) hash_entry_key(itor->ent));
    glist_free(nulls);
    hash_table_free(vocab);
    ckd_free(fsgname);
    ckd_free(lineptr);
    ckd_free(wordptr);
    fsg_model_free(fsg);
    return NULL;
}